

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

_Bool upb_inttable_compact(upb_inttable *t,upb_Arena *a)

{
  bool bVar1;
  long lVar2;
  upb_Arena *a_00;
  _Bool _Var3;
  _Bool _Var4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  upb_value val;
  uintptr_t key;
  upb_value val_1;
  upb_inttable new_t;
  uint32_t counts [17];
  uintptr_t max [17];
  upb_value local_158;
  uintptr_t local_150;
  upb_value local_148;
  ulong local_140;
  upb_Arena *local_138;
  upb_inttable local_130;
  int local_108 [20];
  ulong local_b8 [17];
  
  local_108[0xc] = 0;
  local_108[0xd] = 0;
  local_108[0xe] = 0;
  local_108[0xf] = 0;
  local_108[8] = 0;
  local_108[9] = 0;
  local_108[10] = 0;
  local_108[0xb] = 0;
  local_108[4] = 0;
  local_108[5] = 0;
  local_108[6] = 0;
  local_108[7] = 0;
  local_108[0] = 0;
  local_108[1] = 0;
  local_108[2] = 0;
  local_108[3] = 0;
  local_108[0x10] = 0;
  local_138 = a;
  memset(local_b8,0,0x88);
  local_130.t.entries = (upb_tabent *)0xffffffffffffffff;
  _Var3 = upb_inttable_next(t,&local_150,&local_158,(intptr_t *)&local_130);
  if (_Var3) {
    do {
      if (local_150 == 0) {
        uVar5 = 0;
      }
      else {
        uVar5 = (uint)((local_150 & local_150 - 1) != 0);
      }
      lVar2 = 0x3f;
      if (local_150 != 0) {
        for (; local_150 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      iVar7 = (int)lVar2;
      if (local_150 < 2) {
        iVar7 = 0;
      }
      uVar8 = (ulong)(iVar7 + uVar5);
      if (0xf < iVar7 + uVar5) {
        uVar8 = 0x10;
      }
      uVar6 = local_b8[uVar8];
      if (local_b8[uVar8] <= local_150) {
        uVar6 = local_150;
      }
      local_b8[uVar8] = uVar6;
      local_108[uVar8] = local_108[uVar8] + 1;
      _Var3 = upb_inttable_next(t,&local_150,&local_158,(intptr_t *)&local_130);
    } while (_Var3);
  }
  uVar9 = t->array_count + (t->t).count;
  uVar8 = 0x10;
  uVar5 = uVar9;
  do {
    if (local_108[uVar8] != 0) {
      if ((double)(1 << ((byte)uVar8 & 0x1f)) * 0.1 <= (double)uVar5) goto LAB_0029259d;
      uVar5 = uVar5 - local_108[uVar8];
    }
    bVar1 = 1 < uVar8;
    uVar8 = uVar8 - 1;
  } while (bVar1);
  uVar8 = 0;
LAB_0029259d:
  if (uVar9 < uVar5) {
    __assert_fail("arr_count <= upb_inttable_count(t)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/hash/common.c"
                  ,0x335,"_Bool upb_inttable_compact(upb_inttable *, upb_Arena *)");
  }
  uVar8 = local_b8[(int)uVar8];
  uVar10 = 0;
  if (uVar9 - uVar5 == 0) {
    uVar6 = 0;
  }
  else {
    uVar6 = _upb_entries_needed_for((ulong)(uVar9 - uVar5));
  }
  a_00 = local_138;
  if (uVar6 != 0) {
    uVar10 = (uint)((uVar6 & uVar6 - 1) != 0);
  }
  lVar2 = 0x3f;
  if (uVar6 != 0) {
    for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
    }
  }
  iVar7 = (int)lVar2;
  if (uVar6 < 2) {
    iVar7 = 0;
  }
  uVar5 = 0x10;
  if (iVar7 + uVar10 < 0x10) {
    uVar5 = iVar7 + uVar10;
  }
  _Var3 = upb_inttable_sizedinit(&local_130,(uint32_t)(uVar8 + 1),uVar5,local_138);
  if (_Var3) {
    local_150 = 0xffffffffffffffff;
    local_140 = uVar8 + 1;
    _Var4 = upb_inttable_next(t,&local_158.val,&local_148,(intptr_t *)&local_150);
    if (_Var4) {
      do {
        upb_inttable_insert(&local_130,local_158.val,local_148,a_00);
        _Var4 = upb_inttable_next(t,&local_158.val,&local_148,(intptr_t *)&local_150);
      } while (_Var4);
    }
    if (local_140 != local_130.array_size) {
      __assert_fail("new_t.array_size == arr_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/hash/common.c"
                    ,0x34c,"_Bool upb_inttable_compact(upb_inttable *, upb_Arena *)");
    }
    if (_Var3) {
      t->array_size = local_130.array_size;
      t->array_count = local_130.array_count;
      t->array = local_130.array;
      t->presence_mask = local_130.presence_mask;
      (t->t).entries = local_130.t.entries;
      (t->t).count = local_130.t.count;
      (t->t).mask = local_130.t.mask;
    }
  }
  return _Var3;
}

Assistant:

bool upb_inttable_compact(upb_inttable* t, upb_Arena* a) {
  /* A power-of-two histogram of the table keys. */
  uint32_t counts[UPB_MAXARRSIZE + 1] = {0};

  /* The max key in each bucket. */
  uintptr_t max[UPB_MAXARRSIZE + 1] = {0};

  {
    intptr_t iter = UPB_INTTABLE_BEGIN;
    uintptr_t key;
    upb_value val;
    while (upb_inttable_next(t, &key, &val, &iter)) {
      int bucket = log2ceil(key);
      max[bucket] = UPB_MAX(max[bucket], key);
      counts[bucket]++;
    }
  }

  /* Find the largest power of two that satisfies the MIN_DENSITY
   * definition (while actually having some keys). */
  uint32_t arr_count = upb_inttable_count(t);

  // Scan all buckets except capped bucket
  int size_lg2 = ARRAY_SIZE(counts) - 1;
  for (; size_lg2 > 0; size_lg2--) {
    if (counts[size_lg2] == 0) {
      /* We can halve again without losing any entries. */
      continue;
    } else if (arr_count >= (1 << size_lg2) * MIN_DENSITY) {
      break;
    }

    arr_count -= counts[size_lg2];
  }

  UPB_ASSERT(arr_count <= upb_inttable_count(t));

  upb_inttable new_t;
  {
    /* Insert all elements into new, perfectly-sized table. */
    uintptr_t arr_size = max[size_lg2] + 1; /* +1 so arr[max] will fit. */
    uint32_t hash_count = upb_inttable_count(t) - arr_count;
    size_t hash_size = hash_count ? _upb_entries_needed_for(hash_count) : 0;
    int hashsize_lg2 = log2ceil(hash_size);

    if (!upb_inttable_sizedinit(&new_t, arr_size, hashsize_lg2, a)) {
      return false;
    }

    {
      intptr_t iter = UPB_INTTABLE_BEGIN;
      uintptr_t key;
      upb_value val;
      while (upb_inttable_next(t, &key, &val, &iter)) {
        upb_inttable_insert(&new_t, key, val, a);
      }
    }

    UPB_ASSERT(new_t.array_size == arr_size);
  }
  *t = new_t;
  return true;
}